

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

int __thiscall
google::protobuf::internal::EpsCopyInputStream::BytesAvailable(EpsCopyInputStream *this,char *ptr)

{
  Nonnull<const_char_*> failure_msg;
  int line;
  char *pcVar1;
  int local_24;
  LogMessageFatal local_20;
  char *local_10;
  
  local_20.super_LogMessage._0_8_ = (char *)0x0;
  local_10 = ptr;
  failure_msg = absl::lts_20250127::log_internal::Check_NEImpl<char_const*,decltype(nullptr)>
                          (&local_10,(void **)&local_20,"ptr != nullptr");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    pcVar1 = this->buffer_end_ + (0x10 - (long)local_10);
    local_24 = 0;
    local_20.super_LogMessage._0_8_ = pcVar1;
    failure_msg = absl::lts_20250127::log_internal::Check_GEImpl<long,int>
                            ((long *)&local_20,&local_24,"available >= 0");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      local_24 = 0x7fffffff;
      local_20.super_LogMessage._0_8_ = pcVar1;
      failure_msg = absl::lts_20250127::log_internal::Check_LEImpl<long,int>
                              ((long *)&local_20,&local_24,"available <= INT_MAX");
      if (failure_msg == (Nullable<const_char_*>)0x0) {
        return (int)pcVar1;
      }
      line = 0x178;
    }
    else {
      line = 0x177;
    }
  }
  else {
    line = 0x175;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

int BytesAvailable(const char* ptr) const {
    ABSL_DCHECK_NE(ptr, nullptr);
    ptrdiff_t available = buffer_end_ + kSlopBytes - ptr;
    ABSL_DCHECK_GE(available, 0);
    ABSL_DCHECK_LE(available, INT_MAX);
    return static_cast<int>(available);
  }